

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<int,void(int_const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<int,void(int_const&)> *this,PromiseError *error)

{
  PromiseError local_20;
  PromiseError *local_18;
  PromiseError *error_local;
  PromiseDataBase<int,_void_(const_int_&)> *this_local;
  
  local_18 = error;
  error_local = (PromiseError *)this;
  PromiseError::PromiseError(&local_20,error);
  PromiseError::operator=((PromiseError *)(this + 0x50),&local_20);
  PromiseError::~PromiseError(&local_20);
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }